

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_GetVoiceDetails(FAudioVoice *voice,FAudioVoiceDetails *pVoiceDetails)

{
  code *pcVar1;
  int iVar2;
  undefined4 *in_RSI;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  
  *in_RSI = *(undefined4 *)(in_RDI + 8);
  in_RSI[1] = *(undefined4 *)(in_RDI + 8);
  if (*(int *)(in_RDI + 0xc) == 0) {
    in_RSI[2] = (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 2);
    in_RSI[3] = *(undefined4 *)(*(long *)(in_RDI + 0xf8) + 4);
  }
  else if (*(int *)(in_RDI + 0xc) == 1) {
    in_RSI[2] = *(undefined4 *)(in_RDI + 0xe8);
    in_RSI[3] = *(undefined4 *)(in_RDI + 0xec);
  }
  else if (*(int *)(in_RDI + 0xc) == 2) {
    in_RSI[2] = *(undefined4 *)(in_RDI + 0xd8);
    in_RSI[3] = *(undefined4 *)(in_RDI + 0xdc);
  }
  else {
    do {
      iVar2 = SDL_ReportAssertion(&FAudioVoice_GetVoiceDetails::sdl_assert_data,
                                  "FAudioVoice_GetVoiceDetails",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x436);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  return;
}

Assistant:

void FAudioVoice_GetVoiceDetails(
	FAudioVoice *voice,
	FAudioVoiceDetails *pVoiceDetails
) {
	LOG_API_ENTER(voice->audio)

	pVoiceDetails->CreationFlags = voice->flags;
	pVoiceDetails->ActiveFlags = voice->flags;
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		pVoiceDetails->InputChannels = voice->src.format->nChannels;
		pVoiceDetails->InputSampleRate = voice->src.format->nSamplesPerSec;
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		pVoiceDetails->InputChannels = voice->mix.inputChannels;
		pVoiceDetails->InputSampleRate = voice->mix.inputSampleRate;
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		pVoiceDetails->InputChannels = voice->master.inputChannels;
		pVoiceDetails->InputSampleRate = voice->master.inputSampleRate;
	}
	else
	{
		FAudio_assert(0 && "Unknown voice type!");
	}

	LOG_API_EXIT(voice->audio)
}